

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

uint64_t get_np_dist(uint64_t *np,BiomeTree *bt,int idx)

{
  uint uVar1;
  long local_58;
  long local_50;
  uint32_t i;
  uint64_t d;
  uint64_t b;
  uint64_t a;
  uint64_t node;
  uint64_t ds;
  int idx_local;
  BiomeTree *bt_local;
  uint64_t *np_local;
  
  ds = 0;
  for (i = 0; i < 6; i = i + 1) {
    uVar1 = (uint)(bt->nodes[idx] >> ((byte)(i << 3) & 0x3f)) & 0xff;
    local_50 = np[i] - (long)bt->param[(int)(uVar1 * 2 + 1)];
    local_58 = (long)bt->param[(int)(uVar1 << 1)] - np[i];
    if (local_50 < 1) {
      if (local_58 < 1) {
        local_58 = 0;
      }
      local_50 = local_58;
    }
    ds = local_50 * local_50 + ds;
  }
  return ds;
}

Assistant:

static
uint64_t get_np_dist(const uint64_t np[6], const BiomeTree *bt, int idx)
{
    uint64_t ds = 0, node = bt->nodes[idx];
    uint64_t a, b, d;
    uint32_t i;

    for (i = 0; i < 6; i++)
    {
        idx = (node >> 8*i) & 0xFF;
        a = np[i] - bt->param[2*idx + 1];
        b = bt->param[2*idx + 0] - np[i];
        d = (int64_t)a > 0 ? a : (int64_t)b > 0 ? b : 0;
        d = d * d;
        ds += d;
    }
    return ds;
}